

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O0

void __thiscall
JsonArray_ArrayNoCloseBracket_Test::TestBody(JsonArray_ArrayNoCloseBracket_Test *this)

{
  bool bVar1;
  parser<json_out_callbacks> *this_00;
  error_code *lhs;
  char *message;
  error_code eVar2;
  AssertHelper local_168;
  Message local_160;
  error_code local_158;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  result_type local_118;
  string local_e8;
  undefined1 local_c8 [8];
  parser<json_out_callbacks> p;
  JsonArray_ArrayNoCloseBracket_Test *this_local;
  
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8.field_2._8_8_ = 0;
  local_e8._M_dataplus = (_Alloc_hider)0x0;
  local_e8._1_7_ = 0;
  local_e8._M_string_length = 0;
  p.coordinate_ = (coord)this;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_e8);
  pstore::json::make_parser<json_out_callbacks>
            ((parser<json_out_callbacks> *)local_c8,(json_out_callbacks *)&local_e8,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_e8);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar.message_,"[",1);
  this_00 = pstore::json::parser<json_out_callbacks>::input
                      ((parser<json_out_callbacks> *)local_c8,(string *)&gtest_ar.message_);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_118,this_00);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  lhs = pstore::json::parser<json_out_callbacks>::last_error((parser<json_out_callbacks> *)local_c8)
  ;
  eVar2 = pstore::json::make_error_code(expected_array_member);
  local_158._M_cat = eVar2._M_cat;
  local_158._M_value = eVar2._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_148,"p.last_error ()",
             "make_error_code (json::error_code::expected_array_member)",lhs,&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x42,message);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_c8);
  return;
}

Assistant:

TEST_F (JsonArray, ArrayNoCloseBracket) {
    auto p = json::make_parser (json_out_callbacks{});
    p.input ("["s).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_array_member));
}